

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void UnserializeFromVector<DataStream,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
               (DataStream *s,
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *args)

{
  long lVar1;
  uint64_t uVar2;
  size_type sVar3;
  size_type sVar4;
  error_code *this;
  long in_FS_OFFSET;
  bool in_stack_00000017;
  DataStream *in_stack_00000018;
  size_t remaining_after;
  size_t remaining_before;
  size_t expected_size;
  DataStream *in_stack_ffffffffffffff88;
  io_errc in_stack_ffffffffffffff94;
  DataStream *in_stack_ffffffffffffff98;
  error_code *peVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ReadCompactSize<DataStream>(in_stack_00000018,in_stack_00000017);
  sVar3 = DataStream::size(in_stack_ffffffffffffff98);
  UnserializeMany<DataStream,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
            (in_stack_ffffffffffffff88,
             (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)0xe32602);
  sVar4 = DataStream::size(in_stack_ffffffffffffff98);
  if (sVar4 + uVar2 == sVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    this = (error_code *)__cxa_allocate_exception(0x20);
    peVar5 = this;
    std::error_code::error_code<std::io_errc,void>(this,in_stack_ffffffffffffff94);
    std::ios_base::failure[abi:cxx11]::failure
              ((char *)this,(error_code *)"Size of value was not the stated size");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(peVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UnserializeFromVector(Stream& s, X&&... args)
{
    size_t expected_size = ReadCompactSize(s);
    size_t remaining_before = s.size();
    UnserializeMany(s, args...);
    size_t remaining_after = s.size();
    if (remaining_after + expected_size != remaining_before) {
        throw std::ios_base::failure("Size of value was not the stated size");
    }
}